

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O2

int run_test_tcp_bind6_error_addrinuse(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_220;
  sockaddr_in6 addr;
  uv_tcp_t server2;
  uv_tcp_t server1;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    return 1;
  }
  iVar1 = uv_ip6_addr("::",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server1);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&server1,&addr,0);
      if (iVar1 == 0) {
        uVar2 = uv_default_loop();
        iVar1 = uv_tcp_init(uVar2,&server2);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_bind(&server2,&addr,0);
          if (iVar1 == 0) {
            iVar1 = uv_listen(&server1,0x80,0);
            if (iVar1 == 0) {
              iVar1 = uv_listen(&server2,0x80,0);
              if (iVar1 == -0x62) {
                uv_close(&server1,close_cb);
                uv_close(&server2,close_cb);
                uVar2 = uv_default_loop();
                uv_run(uVar2,0);
                if (close_cb_called == 2) {
                  loop = (uv_loop_t *)uv_default_loop();
                  close_loop(loop);
                  uVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                  uStack_220 = 0x45;
                }
                else {
                  pcVar3 = "close_cb_called == 2";
                  uStack_220 = 0x43;
                }
              }
              else {
                pcVar3 = "r == UV_EADDRINUSE";
                uStack_220 = 0x3c;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_220 = 0x3a;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_220 = 0x37;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_220 = 0x35;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_220 = 0x32;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_220 = 0x30;
    }
  }
  else {
    pcVar3 = "0 == uv_ip6_addr(\"::\", TEST_PORT, &addr)";
    uStack_220 = 0x2d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
          ,uStack_220,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind6_error_addrinuse) {
  struct sockaddr_in6 addr;
  uv_tcp_t server1, server2;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT(r == UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}